

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O3

void __thiscall vkt::ssbo::ShaderInterface::~ShaderInterface(ShaderInterface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StructType *this_00;
  BufferBlock *pBVar2;
  pointer piVar3;
  pointer pcVar4;
  pointer ppBVar5;
  pointer ppSVar6;
  
  ppSVar6 = (this->m_structs).
            super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar6 !=
      (this->m_structs).super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppSVar6;
      if (this_00 != (StructType *)0x0) {
        glu::StructType::~StructType(this_00);
      }
      operator_delete(this_00,0x38);
      ppSVar6 = ppSVar6 + 1;
    } while (ppSVar6 !=
             (this->m_structs).
             super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppBVar5 = (this->m_bufferBlocks).
            super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar5 !=
      (this->m_bufferBlocks).
      super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pBVar2 = *ppBVar5;
      if (pBVar2 != (BufferBlock *)0x0) {
        piVar3 = (pBVar2->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (piVar3 != (pointer)0x0) {
          operator_delete(piVar3,(long)(pBVar2->m_lastUnsizedArraySizes).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)piVar3);
        }
        std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::~vector
                  (&pBVar2->m_variables);
        pcVar4 = (pBVar2->m_instanceName)._M_dataplus._M_p;
        paVar1 = &(pBVar2->m_instanceName).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        pcVar4 = (pBVar2->m_blockName)._M_dataplus._M_p;
        paVar1 = &(pBVar2->m_blockName).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pBVar2,0x80);
      ppBVar5 = ppBVar5 + 1;
    } while (ppBVar5 !=
             (this->m_bufferBlocks).
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    ppBVar5 = (this->m_bufferBlocks).
              super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppBVar5 != (pointer)0x0) {
    operator_delete(ppBVar5,(long)(this->m_bufferBlocks).
                                  super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar5
                   );
  }
  ppSVar6 = (this->m_structs).
            super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar6 != (pointer)0x0) {
    operator_delete(ppSVar6,(long)(this->m_structs).
                                  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar6
                   );
    return;
  }
  return;
}

Assistant:

ShaderInterface::~ShaderInterface (void)
{
	for (std::vector<StructType*>::iterator i = m_structs.begin(); i != m_structs.end(); i++)
		delete *i;

	for (std::vector<BufferBlock*>::iterator i = m_bufferBlocks.begin(); i != m_bufferBlocks.end(); i++)
		delete *i;
}